

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O2

BinaryLocation __thiscall
wasm::Debug::LocationUpdater::getNewExprStart(LocationUpdater *this,BinaryLocation oldAddr)

{
  const_iterator cVar1;
  Expression *local_18;
  Expression *expr;
  
  local_18 = AddrExprMap::getStart(&this->oldExprAddrMap,oldAddr);
  if ((local_18 != (Expression *)0x0) &&
     (cVar1 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)this->newLocations,&local_18),
     cVar1.
     super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false>
     ._M_cur != (__node_type *)0x0)) {
    return *(BinaryLocation *)
            ((long)cVar1.
                   super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::BinaryLocations::Span>,_false>
                   ._M_cur + 0x10);
  }
  return 0;
}

Assistant:

BinaryLocation getNewExprStart(BinaryLocation oldAddr) const {
    if (auto* expr = oldExprAddrMap.getStart(oldAddr)) {
      auto iter = newLocations.expressions.find(expr);
      if (iter != newLocations.expressions.end()) {
        BinaryLocation newAddr = iter->second.start;
        return newAddr;
      }
    }
    return 0;
  }